

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

StructDef * __thiscall flatbuffers::Parser::LookupStruct(Parser *this,string *id)

{
  int *piVar1;
  StructDef *pSVar2;
  
  pSVar2 = SymbolTable<flatbuffers::StructDef>::Lookup(&this->structs_,id);
  if (pSVar2 != (StructDef *)0x0) {
    piVar1 = &(pSVar2->super_Definition).refcount;
    *piVar1 = *piVar1 + 1;
  }
  return pSVar2;
}

Assistant:

StructDef *Parser::LookupStruct(const std::string &id) const {
  auto sd = structs_.Lookup(id);
  if (sd) sd->refcount++;
  return sd;
}